

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimes.cxx
# Opt level: O0

bool __thiscall cmFileTimes::Store(cmFileTimes *this,string *fileName)

{
  bool bVar1;
  int iVar2;
  char *__file;
  utimbuf *__file_times;
  string *fileName_local;
  cmFileTimes *this_local;
  
  bVar1 = IsValid(this);
  if (bVar1) {
    __file = (char *)std::__cxx11::string::c_str();
    __file_times = (utimbuf *)
                   std::unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>::
                   operator->(&this->times);
    iVar2 = utime(__file,__file_times);
    this_local._7_1_ = -1 < iVar2;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileTimes::Store(std::string const& fileName) const
{
  if (!IsValid()) {
    return false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  cmFileTimes::WindowsHandle handle = CreateFileW(
    cmSystemTools::ConvertToWindowsExtendedPath(fileName).c_str(),
    FILE_WRITE_ATTRIBUTES, 0, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!handle) {
    return false;
  }
  return SetFileTime(handle, &this->times->timeCreation,
                     &this->times->timeLastAccess,
                     &this->times->timeLastWrite) != 0;
#else
  return utime(fileName.c_str(), &this->times->timeBuf) >= 0;
#endif
}